

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.cpp
# Opt level: O2

void sublist(char *s,int *skip,int *count,int *numargs)

{
  bool bVar1;
  char *pcVar2;
  int iVar3;
  tagval *ptVar4;
  int iVar5;
  char *s_local;
  char *qend;
  int local_54;
  char *list;
  char *end;
  char *start;
  char *qstart;
  
  local_54 = *skip;
  if (*numargs < 3) {
    iVar5 = -1;
  }
  else {
    iVar5 = 0;
    if (0 < *count) {
      iVar5 = *count;
    }
  }
  iVar3 = 0;
  if (0 < local_54) {
    iVar3 = local_54;
  }
  iVar3 = iVar3 + 1;
  s_local = s;
  do {
    iVar3 = iVar3 + -1;
    if (iVar3 == 0) break;
    bVar1 = parselist(&s_local,&liststart,&listend,&listquotestart,&listquoteend);
  } while (bVar1);
  if (iVar5 < 0) {
    if (0 < local_54) {
      skiplist(&s_local);
    }
    ptVar4 = commandret;
    pcVar2 = newstring(s_local);
  }
  else {
    list = s_local;
    qend = s_local;
    if ((iVar5 != 0) && (bVar1 = parselist(&s_local,&start,&end,&list,&qend), bVar1)) {
      iVar5 = iVar5 + 1;
      do {
        iVar5 = iVar5 + -1;
        if (iVar5 < 2) break;
        bVar1 = parselist(&s_local,&start,&end,&qstart,&qend);
      } while (bVar1);
    }
    ptVar4 = commandret;
    pcVar2 = newstring(list,(long)qend - (long)list);
  }
  ptVar4->type = 3;
  (ptVar4->super_identval).field_0.s = pcVar2;
  return;
}

Assistant:

void sublist(const char *s, int *skip, int *count, int *numargs)
{
    int offset = max(*skip, 0), len = *numargs >= 3 ? max(*count, 0) : -1;
    loopi(offset) if(!parselist(s)) break;
    if(len < 0) { if(offset > 0) skiplist(s); commandret->setstr(newstring(s)); return; }
    const char *list = s, *start, *end, *qstart, *qend = s;
    if(len > 0 && parselist(s, start, end, list, qend)) while(--len > 0 && parselist(s, start, end, qstart, qend));
    commandret->setstr(newstring(list, qend - list));
}